

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

bool __thiscall NJamSpell::TLangModel::Train(TLangModel *this,string *fileName,string *alphabetFile)

{
  TTokenizer *this_00;
  TPerfectHash *this_01;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *this_02;
  pointer pvVar1;
  pointer puVar2;
  ulong uVar3;
  bool bVar4;
  uint32_t uVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  pointer puVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  uint64_t uVar11;
  uint64 uVar12;
  pointer puVar13;
  TWordIds *__range2;
  undefined1 uVar14;
  ulong uVar15;
  long lVar16;
  code *local_330;
  stringbuf checkSumBuf;
  locale local_2f8 [8];
  undefined4 local_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [16];
  undefined1 auStack_2c8 [8];
  ostream checkSumOut;
  uint uStack_2bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [16];
  undefined1 local_1b0 [8];
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
  grams2;
  unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
  grams3;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  grams1;
  wstring trainText;
  string checkSumStr;
  uint64_t trainStarTime;
  _Hash_node_base *local_b8;
  long local_b0;
  pointer local_a8;
  long local_a0;
  ulong local_98;
  double local_90;
  ulong local_88;
  uint64_t local_80;
  undefined1 local_78 [8];
  TIdSentences sentenceIds;
  TSentences local_58;
  TLangModel *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[info] loading text",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  checkSumStr.field_2._8_8_ = GetCurrentTimeMs();
  this_00 = &this->Tokenizer;
  local_38 = this;
  bVar4 = TTokenizer::LoadAlphabet(this_00,alphabetFile);
  if (bVar4) {
    LoadFile((string *)auStack_2c8,fileName);
    UTF8ToWide((wstring *)&grams1._M_h._M_single_bucket,(string *)auStack_2c8);
    if (auStack_2c8 != (undefined1  [8])local_2b8) {
      operator_delete((void *)auStack_2c8);
    }
    ToLower((wstring *)&grams1._M_h._M_single_bucket);
    TTokenizer::Process(&local_58,this_00,(wstring *)&grams1._M_h._M_single_bucket);
    uVar15 = CONCAT71((int7)((ulong)this_00 >> 8),
                      local_58.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_58.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    if (local_58.
        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.
        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[error] no sentences",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      ConvertToIds((TIdSentences *)local_78,local_38,&local_58);
      if ((long)local_58.
                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58.
                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
          (long)sentenceIds.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_78) {
        __assert_fail("sentences.size() == sentenceIds.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                      ,0x74,
                      "bool NJamSpell::TLangModel::Train(const std::string &, const std::string &)")
        ;
      }
      _checkSumOut = (key_type)0x0;
      local_2b8[0]._M_allocated_capacity = local_2b8[0]._M_allocated_capacity & 0xffffffff00000000;
      auStack_2c8 = (undefined1  [8])local_2b8;
      std::__cxx11::wstring::swap((wstring *)&grams1._M_h._M_single_bucket);
      if (auStack_2c8 != (undefined1  [8])local_2b8) {
        operator_delete((void *)auStack_2c8);
      }
      local_2b8[0]._0_8_ =
           local_58.
           super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      _checkSumOut = (key_type)
                     local_58.
                     super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      auStack_2c8 = (undefined1  [8])
                    local_58.
                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                 *)auStack_2c8);
      grams3._M_h._M_single_bucket = (__node_base_ptr)&grams1._M_h._M_rehash_policy._M_next_resize;
      grams1._M_h._M_buckets = (__buckets_ptr)0x1;
      grams1._M_h._M_bucket_count = 0;
      grams1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      grams1._M_h._M_element_count._0_4_ = 0x3f800000;
      grams1._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      grams1._M_h._M_rehash_policy._4_4_ = 0;
      grams1._M_h._M_rehash_policy._M_next_resize = 0;
      local_1b0 = (undefined1  [8])&grams2._M_h._M_rehash_policy._M_next_resize;
      grams2._M_h._M_buckets = (__buckets_ptr)0x1;
      grams2._M_h._M_bucket_count = 0;
      grams2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      grams2._M_h._M_element_count._0_4_ = 0x3f800000;
      grams2._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      grams2._M_h._M_rehash_policy._4_4_ = 0;
      grams2._M_h._M_rehash_policy._M_next_resize = 0;
      grams2._M_h._M_single_bucket = (__node_base_ptr)&grams3._M_h._M_rehash_policy._M_next_resize;
      grams3._M_h._M_buckets = (__buckets_ptr)0x1;
      grams3._M_h._M_bucket_count = 0;
      grams3._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      grams3._M_h._M_element_count._0_4_ = 0x3f800000;
      grams3._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      grams3._M_h._M_rehash_policy._4_4_ = 0;
      grams3._M_h._M_rehash_policy._M_next_resize = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] generating N-grams ",0x1a);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      sentenceIds.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)uVar15;
      local_80 = GetCurrentTimeMs();
      if ((long)sentenceIds.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_78 != 0) {
        uVar15 = ((long)sentenceIds.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)local_78 >> 3) *
                 -0x5555555555555555;
        local_98 = uVar15 + (uVar15 == 0);
        local_90 = (double)uVar15;
        uVar15 = 0;
        do {
          pvVar1 = (pointer)((long)local_78 + uVar15 * 0x18);
          puVar8 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          puVar2 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          puVar13 = puVar8;
          local_88 = uVar15;
          if (puVar8 != puVar2) {
            do {
              auStack_2c8._0_4_ = *puVar8;
              pmVar7 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&grams3._M_h._M_single_bucket,(key_type *)auStack_2c8);
              *pmVar7 = *pmVar7 + 1;
              local_38->TotalWords = local_38->TotalWords + 1;
              puVar8 = puVar8 + 1;
            } while (puVar8 != puVar2);
            puVar13 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar8 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          if (1 < (int)((ulong)((long)puVar8 - (long)puVar13) >> 2)) {
            lVar16 = 0;
            do {
              auStack_2c8._4_4_ = puVar13[lVar16 + 1];
              auStack_2c8._0_4_ = puVar13[lVar16];
              pmVar9 = std::__detail::
                       _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_1b0,(key_type *)auStack_2c8);
              lVar16 = lVar16 + 1;
              *pmVar9 = *pmVar9 + 1;
              puVar13 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar15 = (long)(pvVar1->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar13;
            } while (lVar16 < (long)(uVar15 * 0x40000000 + -0x100000000) >> 0x20);
            if (2 < (int)(uVar15 >> 2)) {
              lVar16 = 0;
              do {
                auStack_2c8._4_4_ = puVar13[lVar16 + 1];
                auStack_2c8._0_4_ = puVar13[lVar16 + 2];
                _checkSumOut = puVar13[lVar16];
                pmVar10 = std::__detail::
                          _Map_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&grams2._M_h._M_single_bucket,(key_type *)auStack_2c8);
                *pmVar10 = *pmVar10 + 1;
                lVar16 = lVar16 + 1;
                puVar13 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start;
              } while (lVar16 < ((long)(pvVar1->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar13)
                                * 0x40000000 + -0x200000000 >> 0x20);
            }
          }
          uVar11 = GetCurrentTimeMs();
          uVar3 = local_98;
          if (4000 < uVar11 - local_80) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[info] processed ",0x11);
            poVar6 = std::ostream::_M_insert<double>(((double)local_88 * 100.0) / local_90);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"%",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            local_80 = uVar11;
          }
          uVar15 = local_88 + 1;
        } while (uVar15 != uVar3);
      }
      local_38->VocabSize = (TWordId)grams1._M_h._M_before_begin._M_nxt;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] generating keys",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      auStack_2c8._0_4_ = 0;
      auStack_2c8._4_4_ = 0;
      _checkSumOut = (key_type)0x0;
      local_2b8[0]._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_2c8,
                (long)&(grams3._M_h._M_before_begin._M_nxt)->_M_nxt +
                (long)&(grams1._M_h._M_before_begin._M_nxt)->_M_nxt +
                (long)&(grams2._M_h._M_before_begin._M_nxt)->_M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] ngrams1: ",0x10);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] ngrams2: ",0x10);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] ngrams3: ",0x10);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[info] total: ",0xe)
      ;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      PrepareNgramKeys<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&grams3._M_h._M_single_bucket,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_2c8);
      PrepareNgramKeys<std::unordered_map<std::pair<unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram2KeyHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)local_1b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_2c8);
      PrepareNgramKeys<std::unordered_map<std::tuple<unsigned_int,unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram3KeyHash,std::equal_to<std::tuple<unsigned_int,unsigned_int,unsigned_int>>,std::allocator<std::pair<std::tuple<unsigned_int,unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)&grams2._M_h._M_single_bucket,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_2c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] generating perf hash",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      this_01 = &local_38->PerfectHash;
      TPerfectHash::Init(this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)auStack_2c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_2c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] finished, buckets: ",0x1a);
      TPerfectHash::BucketsNumber(this_01);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      uVar5 = TPerfectHash::BucketsNumber(this_01);
      this_02 = &local_38->Buckets;
      std::
      vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
      ::resize(this_02,(ulong)uVar5);
      InitializeBuckets<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&grams3._M_h._M_single_bucket,this_01,this_02);
      InitializeBuckets<std::unordered_map<std::pair<unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram2KeyHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)local_1b0,this_01,this_02);
      InitializeBuckets<std::unordered_map<std::tuple<unsigned_int,unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram3KeyHash,std::equal_to<std::tuple<unsigned_int,unsigned_int,unsigned_int>>,std::allocator<std::pair<std::tuple<unsigned_int,unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)&grams2._M_h._M_single_bucket,this_01,this_02);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] buckets filled",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      local_330 = __assert_fail;
      _checkSumBuf = 0;
      std::locale::locale(local_2f8);
      local_330 = std::locale::locale;
      local_2f0 = 0x18;
      local_2e0 = 0;
      local_2d8[0] = 0;
      local_2e8 = local_2d8;
      std::ostream::ostream(auStack_2c8,(streambuf *)&local_330);
      trainText.field_2._8_8_ = grams1._M_h._M_before_begin._M_nxt;
      trainStarTime = (uint64_t)grams2._M_h._M_before_begin._M_nxt;
      local_b8 = grams3._M_h._M_before_begin._M_nxt;
      local_b0 = (long)(local_38->Buckets).
                       super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_38->Buckets).
                       super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2;
      local_a8 = trainText._M_dataplus._M_p;
      local_a0 = ((long)local_58.
                        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.
                        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      std::ostream::write(auStack_2c8,(long)((long)&checkSumStr.field_2 + 8));
      std::ostream::write(auStack_2c8,(long)((long)&trainText.field_2 + 8));
      std::ostream::write(auStack_2c8,(long)&trainStarTime);
      std::ostream::write(auStack_2c8,(long)&local_b8);
      std::ostream::write(auStack_2c8,(long)&local_b0);
      std::ostream::write(auStack_2c8,(long)&local_a8);
      std::ostream::write(auStack_2c8,(long)&local_a0);
      std::__cxx11::stringbuf::str();
      uVar12 = CityHash64((char *)trainText.field_2._8_8_,(size_t)checkSumStr._M_dataplus._M_p);
      local_38->CheckSum = uVar12;
      if ((size_type *)trainText.field_2._8_8_ != &checkSumStr._M_string_length) {
        operator_delete((void *)trainText.field_2._8_8_);
      }
      std::ios_base::~ios_base((ios_base *)&checkSumOut);
      local_330 = std::locale::locale;
      if (local_2e8 != local_2d8) {
        operator_delete(local_2e8);
      }
      local_330 = __assert_fail;
      std::locale::~locale(local_2f8);
      std::
      _Hashtable<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&grams2._M_h._M_single_bucket);
      std::
      _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1b0);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&grams3._M_h._M_single_bucket);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_78);
      uVar15 = (ulong)sentenceIds.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    uVar14 = (undefined1)uVar15;
    std::
    vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    ::~vector(&local_58);
    if (grams1._M_h._M_single_bucket != (__node_base_ptr)&trainText._M_string_length) {
      operator_delete(grams1._M_h._M_single_bucket);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[error] failed to load alphabet",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    uVar14 = 0;
  }
  return (bool)uVar14;
}

Assistant:

bool TLangModel::Train(const std::string& fileName, const std::string& alphabetFile) {

    std::cerr << "[info] loading text" << std::endl;
    uint64_t trainStarTime = GetCurrentTimeMs();
    if (!Tokenizer.LoadAlphabet(alphabetFile)) {
        std::cerr << "[error] failed to load alphabet" << std::endl;
        return false;
    }
    std::wstring trainText = UTF8ToWide(LoadFile(fileName));
    ToLower(trainText);
    TSentences sentences = Tokenizer.Process(trainText);
    if (sentences.empty()) {
        std::cerr << "[error] no sentences" << std::endl;
        return false;
    }

    TIdSentences sentenceIds = ConvertToIds(sentences);

    assert(sentences.size() == sentenceIds.size());
    {
        std::wstring tmp;
        trainText.swap(tmp);
    }
    {
        TSentences tmp;
        sentences.swap(tmp);
    }

    std::unordered_map<TGram1Key, TCount> grams1;
    std::unordered_map<TGram2Key, TCount, TGram2KeyHash> grams2;
    std::unordered_map<TGram3Key, TCount, TGram3KeyHash> grams3;

    std::cerr << "[info] generating N-grams " << sentenceIds.size() << std::endl;
    uint64_t lastTime = GetCurrentTimeMs();
    size_t total = sentenceIds.size();
    for (size_t i = 0; i < total; ++i) {
        const TWordIds& words = sentenceIds[i];

        for (auto w: words) {
            grams1[w] += 1;
            TotalWords += 1;
        }

        for (ssize_t j = 0; j < (ssize_t)words.size() - 1; ++j) {
            TGram2Key key(words[j], words[j+1]);
            grams2[key] += 1;
        }
        for (ssize_t j = 0; j < (ssize_t)words.size() - 2; ++j) {
            TGram3Key key(words[j], words[j+1], words[j+2]);
            grams3[key] += 1;
        }
        uint64_t currTime = GetCurrentTimeMs();
        if (currTime - lastTime > 4000) {
            std::cerr << "[info] processed " << (100.0 * float(i) / float(total)) << "%" << std::endl;
            lastTime = currTime;
        }
    }

    VocabSize = grams1.size();

    std::cerr << "[info] generating keys" << std::endl;

    {
        std::vector<std::string> keys;
        keys.reserve(grams1.size() + grams2.size() + grams3.size());

        std::cerr << "[info] ngrams1: " << grams1.size() << "\n";
        std::cerr << "[info] ngrams2: " << grams2.size() << "\n";
        std::cerr << "[info] ngrams3: " << grams3.size() << "\n";
        std::cerr << "[info] total: " << grams3.size() + grams2.size() + grams1.size() << "\n";

        PrepareNgramKeys(grams1, keys);
        PrepareNgramKeys(grams2, keys);
        PrepareNgramKeys(grams3, keys);

        std::cerr << "[info] generating perf hash" << std::endl;

        PerfectHash.Init(keys);
    }

    std::cerr << "[info] finished, buckets: " << PerfectHash.BucketsNumber() << "\n";

    Buckets.resize(PerfectHash.BucketsNumber());
    InitializeBuckets(grams1, PerfectHash, Buckets);
    InitializeBuckets(grams2, PerfectHash, Buckets);
    InitializeBuckets(grams3, PerfectHash, Buckets);

    std::cerr << "[info] buckets filled" << std::endl;

    std::stringbuf checkSumBuf;
    std::ostream checkSumOut(&checkSumBuf);
    NHandyPack::Dump(checkSumOut, trainStarTime, grams1.size(), grams2.size(),
                    grams3.size(), Buckets.size(), trainText.size(), sentences.size());
    std::string checkSumStr = checkSumBuf.str();
    CheckSum = CityHash64(&checkSumStr[0], checkSumStr.size());
    return true;
}